

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O2

MPP_RET hal_h265e_v510_ret_task(void *hal,HalEncTask *task)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  EncRcTask *pEVar7;
  EncRcTask *pEVar8;
  uint *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  byte bVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  RK_U32 RVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  bool bVar32;
  
  lVar6 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  pEVar7 = task->rc_task;
  sVar17 = mpp_packet_get_length(task->packet);
  bVar32 = true;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0xa06);
    bVar32 = (hal_h265e_debug & 4) == 0;
  }
  pEVar8 = task->rc_task;
  lVar18 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  iVar27 = *(int *)(*(long *)((long)hal + 0x390) + 0xc);
  iVar22 = *(int *)(*(long *)((long)hal + 0x390) + 0x10);
  puVar9 = *(uint **)(lVar18 + 0x20);
  uVar16 = *puVar9;
  if (!bVar32) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x8c8);
  }
  RVar25 = hal_h265e_debug;
  *(int *)(lVar18 + 0x30) = *(int *)(lVar18 + 0x30) + puVar9[4];
  *(int *)(lVar18 + 0x34) = *(int *)(lVar18 + 0x34) + puVar9[1];
  *(long *)(lVar18 + 0x40) =
       *(long *)(lVar18 + 0x40) + (ulong)(puVar9[3] << 0x10 | puVar9[2] >> 0x10);
  *(uint *)(lVar18 + 0x28) = uVar16;
  if ((RVar25 & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","hw_status: 0x%08x",(char *)0x0,(ulong)uVar16);
  }
  if ((uVar16 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_LINKTABLE_FINISH","vepu510_h265_set_feedback");
  }
  if (((uVar16 & 1) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if (((uVar16 & 8) != 0) && ((hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v510","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
  }
  if ((uVar16 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu510_h265_set_feedback");
  }
  if ((uVar16 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu510_h265_set_feedback");
  }
  if ((uVar16 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_FULL","vepu510_h265_set_feedback");
  }
  if ((uVar16 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_WRITE_ERROR","vepu510_h265_set_feedback");
  }
  iVar27 = (iVar22 + 7U & 0x1ffffff8) * (iVar27 + 7U & 0xfffffff8);
  if ((char)uVar16 < '\0') {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_BUS_READ_ERROR","vepu510_h265_set_feedback");
  }
  uVar28 = iVar27 >> 4;
  if ((uVar16 >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v510","RKV_ENC_INT_TIMEOUT_ERROR","vepu510_h265_set_feedback");
  }
  *(int *)(lVar18 + 0x140) = *(int *)(lVar18 + 0x140) + (puVar9[0x29] & 0x7fffff);
  *(int *)(lVar18 + 0x48) = *(int *)(lVar18 + 0x48) + (puVar9[0x21] & 0x1ffff);
  *(int *)(lVar18 + 0x4c) = *(int *)(lVar18 + 0x4c) + (puVar9[0x22] & 0x7ffff);
  iVar30 = (puVar9[0x25] & 0x7ffff) + *(int *)(lVar18 + 0x58);
  *(int *)(lVar18 + 0x58) = iVar30;
  *(int *)(lVar18 + 0x50) = *(int *)(lVar18 + 0x50) + (puVar9[0x23] & 0x1fffff);
  iVar29 = (puVar9[0x26] & 0x1fffff) + *(int *)(lVar18 + 0x5c);
  *(int *)(lVar18 + 0x5c) = iVar29;
  *(int *)(lVar18 + 0x54) = *(int *)(lVar18 + 0x54) + (puVar9[0x24] & 0x7fffff);
  iVar22 = (puVar9[0x27] & 0x7fffff) + *(int *)(lVar18 + 0x60);
  *(int *)(lVar18 + 0x60) = iVar22;
  iVar23 = (puVar9[0x28] & 0x7fffff) + *(int *)(lVar18 + 100);
  *(int *)(lVar18 + 100) = iVar23;
  *(uint *)((long)hal + 0x200) = puVar9[0x52] >> 0xf;
  *(uint *)((long)hal + 0x204) = puVar9[0x53] >> 0xf;
  *(uint *)((long)hal + 0x208) = puVar9[0x4e];
  uVar16 = iVar27 >> 6;
  *(uint *)((long)hal + 0x1e4) = puVar9[0x29] & 0x7fffff;
  memcpy((void *)(lVar18 + 0x68),puVar9 + 0x61,0xd0);
  if (0 < (int)uVar28) {
    (pEVar8->info).iblk4_prop =
         (uint)((iVar23 + iVar22) * 0x400 + iVar30 * 0x4000 + iVar29 * 0x1000) / uVar28;
  }
  if (0 < (int)uVar16) {
    (pEVar8->info).quality_real = *(uint *)(lVar18 + 0x30) / uVar16;
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x905);
  }
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar17,*(RK_U32 *)(lVar6 + 0x34),"hal_h265e_v510_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)(lVar6 + 0x34));
  (pEVar7->info).sse = *(RK_S64 *)(lVar6 + 0x40);
  uVar13 = *(undefined8 *)(lVar6 + 0x48);
  uVar14 = *(undefined8 *)(lVar6 + 0x50);
  (pEVar7->info).lvl64_inter_num = (int)uVar13;
  (pEVar7->info).lvl32_inter_num = (int)((ulong)uVar13 >> 0x20);
  (pEVar7->info).lvl16_inter_num = (int)uVar14;
  (pEVar7->info).lvl8_inter_num = (int)((ulong)uVar14 >> 0x20);
  uVar13 = *(undefined8 *)(lVar6 + 0x58);
  uVar14 = *(undefined8 *)(lVar6 + 0x60);
  (pEVar7->info).lvl32_intra_num = (int)uVar13;
  (pEVar7->info).lvl16_intra_num = (int)((ulong)uVar13 >> 0x20);
  (pEVar7->info).lvl8_intra_num = (int)uVar14;
  (pEVar7->info).lvl4_intra_num = (int)((ulong)uVar14 >> 0x20);
  iVar27 = *(int *)(lVar6 + 0x34);
  task->hw_length = iVar27;
  task->length = task->length + iVar27;
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar6 + 0x10));
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3a8),*(RK_S32 *)(lVar6 + 0x14));
  if (*(long **)((long)hal + 0x428) != (long *)0x0) {
    lVar18 = **(long **)((long)hal + 0x428);
    lVar10 = *(long *)(lVar18 + 0x80 + (long)(task->flags).reg_idx * 8);
    lVar11 = *(long *)(lVar10 + 0x20);
    uVar16 = *(uint *)(lVar11 + 0xc4);
    uVar28 = *(uint *)(lVar11 + 0xcc);
    uVar24 = *(uint *)(lVar11 + 0xd4);
    uVar1 = *(uint *)(lVar11 + 0xdc);
    iVar31 = (uVar1 >> 0x10) + (uVar24 >> 0x10) + (uVar28 >> 0x10) + (uVar16 >> 0x10);
    iVar27 = (*(uint *)(lVar11 + 0xe0) & 0xffff) + (*(uint *)(lVar11 + 0xd8) & 0xffff) +
             (*(uint *)(lVar11 + 0xd0) & 0xffff) + (*(uint *)(lVar11 + 200) & 0xffff);
    iVar22 = (*(uint *)(lVar11 + 0xe0) >> 0x10) + (*(uint *)(lVar11 + 0xd8) >> 0x10) +
             (*(uint *)(lVar11 + 0xd0) >> 0x10) + (*(uint *)(lVar11 + 200) >> 0x10);
    uVar2 = *(uint *)(lVar11 + 0xe4);
    uVar3 = *(uint *)(lVar11 + 0xec);
    uVar4 = *(uint *)(lVar11 + 0xf4);
    uVar5 = *(uint *)(lVar11 + 0xfc);
    iVar29 = (uVar5 >> 0x10) + (uVar4 >> 0x10) + (uVar3 >> 0x10) + (uVar2 >> 0x10);
    iVar23 = (*(uint *)(lVar11 + 0x100) & 0xffff) + (*(uint *)(lVar11 + 0xf8) & 0xffff) +
             (*(uint *)(lVar11 + 0xf0) & 0xffff) + (*(uint *)(lVar11 + 0xe8) & 0xffff);
    iVar30 = (*(uint *)(lVar11 + 0x100) >> 0x10) + (*(uint *)(lVar11 + 0xf8) >> 0x10) +
             (*(uint *)(lVar11 + 0xf0) >> 0x10) + (*(uint *)(lVar11 + 0xe8) >> 0x10);
    uVar15 = (int)((*(int *)(*(long *)(lVar18 + 0x390) + 0x10) + 0xfU & 0xffffff0) *
                  (*(int *)(*(long *)(lVar18 + 0x390) + 0xc) + 0xfU & 0xfffffff0)) >> 8;
    uVar19 = (((uint)(iVar27 * 5 + iVar22 * 6) >> 2) + iVar31) * 100;
    RVar25 = (RK_U32)(uVar15 * 0xd < uVar19);
    if (uVar15 * 0x1e < uVar19) {
      RVar25 = 2;
    }
    pEVar7 = task->rc_task;
    lVar12 = *(long *)(lVar10 + 0x18);
    (pEVar7->info).complex_level = RVar25;
    if (*(int *)(lVar18 + 0x3f4) == 0) {
      iVar20 = iVar30 * 0x18;
      iVar26 = iVar29 * 0x11 + iVar23 * 0x16;
    }
    else {
      iVar20 = iVar30 * 0xc;
      iVar26 = iVar23 * 0xb + iVar29 * 8;
    }
    uVar19 = ((uint)(iVar26 + iVar20) >> 2) * 100;
    RVar25 = 200;
    if (uVar19 <= uVar15 * 0xf) {
      if (uVar15 * 5 < uVar19) {
        RVar25 = 100;
      }
      else {
        RVar25 = (RK_U32)(uVar15 >> 2 < uVar19);
      }
    }
    iVar20 = (uVar28 & 0xffff) + (uVar16 & 0xffff) + (uVar24 & 0xffff) + (uVar1 & 0xffff);
    (pEVar7->info).motion_level = RVar25;
    if ((hal_h265e_debug & 0x40000) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","complex_level %d motion_level %d\n",(char *)0x0);
    }
    iVar26 = (uVar3 & 0xffff) + (uVar2 & 0xffff) + (uVar4 & 0xffff) + (uVar5 & 0xffff);
    uVar16 = *(uint *)(lVar12 + 0x24c);
    uVar24 = uVar16 >> 8 & 0xff;
    uVar28 = uVar16 >> 0x10 & 0xff;
    uVar16 = uVar28 * iVar22 + (uVar16 & 0xff) * iVar20 + ((uVar24 + (uVar16 & 0xff)) * iVar31 >> 1)
             + ((uVar24 + uVar28) * iVar27 >> 1);
    uVar28 = iVar20 + iVar31 + iVar27 + iVar22;
    if (uVar28 != 0) {
      uVar16 = uVar16 / uVar28;
    }
    *(uint *)(lVar10 + 0x13c) = uVar16;
    uVar24 = *(uint *)(lVar12 + 0x250) & 0xfff;
    uVar28 = *(uint *)(lVar12 + 0x250) >> 0x10 & 0xfff;
    uVar16 = *(uint *)(lVar12 + 0x254) & 0xfff;
    uVar16 = uVar16 * iVar30 + uVar24 * iVar26 + ((uVar28 + uVar24) * iVar29 >> 1) +
             ((uVar28 + uVar16) * iVar23 >> 1);
    uVar28 = iVar26 + iVar29 + iVar23 + iVar30;
    if (uVar28 != 0) {
      uVar16 = uVar16 / uVar28;
    }
    *(uint *)(lVar10 + 0x138) = uVar16;
    *(int *)(lVar10 + 0x140) = *(int *)(lVar10 + 0x140) + (*(uint *)(lVar11 + 0xa4) & 0x7fffff);
    *(uint *)(lVar10 + 0x2c) = *(uint *)&task->rc_task->frm >> 3 & 2;
    uVar16 = *(int *)(lVar10 + 0x34) * 8 + (pEVar7->info).bit_real;
    (pEVar7->info).bit_real = uVar16;
    if ((hal_h265e_debug & 0x40000) != 0) {
      _mpp_log_l(4,"hal_h265e_v510","bit_real %d quality_real %d\n",(char *)0x0,(ulong)uVar16,
                 (ulong)(uint)(pEVar7->info).quality_real);
      uVar16 = (pEVar7->info).bit_real;
    }
    iVar27 = (pEVar7->info).bit_target;
    *(undefined2 *)(lVar10 + 0x170) = *(undefined2 *)(lVar18 + 0x360);
    *(undefined4 *)(lVar10 + 0x16c) = *(undefined4 *)(lVar18 + 0x35c);
    for (lVar18 = 0x170; -1 < (int)(lVar18 - 0x16dU); lVar18 = lVar18 + -1) {
      *(undefined1 *)(lVar10 + lVar18) =
           *(undefined1 *)(lVar10 + 0x16c + (lVar18 - 0x16dU & 0xffffffff));
    }
    if ((int)uVar16 < iVar27) {
      bVar21 = 3;
      if ((iVar27 <= (int)(uVar16 * 6) / 4) && (bVar21 = 2, iVar27 <= (int)(uVar16 * 5) / 4)) {
        bVar21 = (int)(uVar16 * 9) / 8 < iVar27;
      }
    }
    else {
      bVar21 = 0xfb;
      if (((uVar16 == iVar27 * 2 || SBORROW4(uVar16,iVar27 * 2) != (int)(uVar16 + iVar27 * -2) < 0)
          && (bVar21 = 0xfc, (int)uVar16 <= (iVar27 * 7) / 4)) &&
         (bVar21 = 0xfd, (int)uVar16 <= (iVar27 * 6) / 4)) {
        bVar21 = ~((iVar27 * 5) / 4 < (int)uVar16);
      }
    }
    *(byte *)(lVar10 + 0x16c) = bVar21;
    iVar27 = 0;
    for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
      iVar27 = iVar27 + (char)((byte *)(lVar10 + 0x16c))[lVar18];
    }
    if (((ulong)task->rc_task->frm & 0x10) != 0) {
      *(undefined1 *)(lVar10 + 0x171) = 0;
    }
    if (iVar27 < -9) {
      *(undefined1 *)(lVar10 + 0x171) = 2;
    }
    else if ((iVar27 < -2) && (*(char *)(lVar10 + 0x171) < '\x02')) {
      *(undefined1 *)(lVar10 + 0x171) = 1;
    }
    uVar16 = 0;
    uVar28 = 0;
    if (*(uint *)(lVar10 + 0x140) != 0) {
      uVar28 = *(uint *)(lVar10 + 0x13c) / *(uint *)(lVar10 + 0x140);
    }
    *(uint *)(lVar10 + 0x13c) = uVar28;
    if (*(uint *)(lVar10 + 0x144) != 0) {
      uVar16 = *(uint *)(lVar10 + 0x138) / *(uint *)(lVar10 + 0x144);
    }
    *(uint *)(lVar10 + 0x138) = uVar16;
    (pEVar7->info).madi = uVar28;
    (pEVar7->info).madp = uVar16;
  }
  if ((hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)(lVar6 + 0x34));
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0xa1f);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v510_ret_task(void *hal, HalEncTask *task)
{
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu510H265eFrmCfg *frm = ctx->frms[task_idx];
    Vepu510H265Fbk *fb = &frm->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu510_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    h265e_dpb_hal_end(ctx->dpb, frm->hal_curr_idx);
    h265e_dpb_hal_end(ctx->dpb, frm->hal_refr_idx);

    vepu510_h265e_tune_stat_update(ctx->tune, enc_task);

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);
    hal_h265e_leave();
    return MPP_OK;
}